

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_recovery.cc
# Opt level: O2

void __thiscall
ClockRecovery::work(ClockRecovery *this,
                   shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                        *qout)

{
  _Head_base<0UL,_SamplePublisher_*,_false> _Var1;
  _Head_base<0UL,_SamplePublisher_*,_false> _Var2;
  const_iterator __first;
  _Head_base<0UL,_SamplePublisher_*,_false> _Var3;
  shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *psVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar11;
  float fVar12;
  float fVar13;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  output;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  undefined1 local_88 [8];
  undefined1 local_80 [24];
  complex<float> local_68;
  complex<float> local_60;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  local_58;
  shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *local_50;
  float local_48;
  
  iVar5 = (int)(qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             local_80);
  if ((undefined8 *)local_80._0_8_ == (undefined8 *)0x0) {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              ((qout->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,iVar5);
  }
  else {
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               local_88);
    local_80._8_8_ = this + 9;
    std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
    insert<__gnu_cxx::__normal_iterator<std::complex<float>*,std::vector<std::complex<float>,std::allocator<std::complex<float>>>>,void>
              ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)local_80._8_8_,
               (complex<float> *)
               this[10].samplePublisher._M_t.
               super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
               super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
               super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl,
               *(complex<float> **)local_80._0_8_,*(complex<float> **)(local_80._0_8_ + 8));
    local_58._M_t.
    super___uniq_ptr_impl<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    .
    super__Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_true,_true>
            )local_80._0_8_;
    local_80._0_8_ = (undefined8 *)0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((qin->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,&local_58);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr(&local_58);
    uVar8 = (long)this[10].samplePublisher._M_t.
                  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
                  .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl -
            (long)this[9].samplePublisher._M_t.
                  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
                  .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl >> 3;
    if (*(pointer *)((long)local_88 + 8) != *(pointer *)local_88) {
      *(pointer *)((long)local_88 + 8) = *(pointer *)local_88;
    }
    fVar9 = (float)uVar8 /
            *(float *)&(this->samplePublisher)._M_t.
                       super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                       .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    uVar6 = (ulong)fVar9;
    local_50 = qout;
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::reserve
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_88,
               (long)(fVar9 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6);
    uVar6 = 0;
    while (__first._M_current = *(complex<float> **)local_80._8_8_, uVar6 < uVar8) {
      fVar9 = *(float *)&this[2].samplePublisher._M_t.
                         super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                         .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      iVar5 = (int)fVar9;
      if (uVar8 <= uVar6 + (long)iVar5 + 7) break;
      uVar6 = uVar6 + (long)iVar5;
      fVar9 = fVar9 - (float)iVar5;
      *(float *)&this[2].samplePublisher._M_t.
                 super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
                 super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                 super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = fVar9;
      fVar10 = 0.0;
      fVar12 = 0.0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        fVar10 = fVar10 + mmseTaps[(int)(fVar9 * 128.0)][lVar7] *
                          (float)__first._M_current[uVar6 + lVar7]._M_value;
        fVar12 = fVar12 + mmseTaps[(int)(fVar9 * 128.0)][lVar7] *
                          (float)(__first._M_current[uVar6 + lVar7]._M_value >> 0x20);
      }
      _Var1._M_head_impl =
           this[4].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      _Var2._M_head_impl =
           this[6].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      _Var3._M_head_impl =
           this[7].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      this[4].samplePublisher._M_t.
      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
      super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
           this[3].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      this[5].samplePublisher._M_t.
      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
      super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = _Var1._M_head_impl;
      _Var1._M_head_impl._4_4_ = fVar12;
      _Var1._M_head_impl._0_4_ = fVar10;
      this[3].samplePublisher._M_t.
      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
      super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = _Var1._M_head_impl;
      this[7].samplePublisher._M_t.
      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
      super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = _Var2._M_head_impl;
      this[8].samplePublisher._M_t.
      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
      super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = _Var3._M_head_impl;
      this[6].samplePublisher._M_t.
      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
      super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
           (SamplePublisher *)
           (CONCAT44(-(uint)(0.0 < fVar12),-(uint)(0.0 < fVar10)) & 0x3f8000003f800000);
      std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::push_back
                ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_88,
                 (value_type *)(this + 3));
      _Var1._M_head_impl =
           this[6].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      _Var2._M_head_impl =
           this[8].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      local_60._M_value =
           CONCAT44((float)((ulong)_Var1._M_head_impl >> 0x20) -
                    (float)((ulong)_Var2._M_head_impl >> 0x20),
                    SUB84(_Var1._M_head_impl,0) - SUB84(_Var2._M_head_impl,0));
      local_68._M_value =
           (ulong)this[4].samplePublisher._M_t.
                  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
                  .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl ^ 0x8000000000000000;
      std::operator*(&local_60,&local_68);
      _Var1._M_head_impl =
           this[3].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      _Var2._M_head_impl =
           this[5].samplePublisher._M_t.
           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
           super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      local_60._M_value =
           CONCAT44((float)((ulong)_Var1._M_head_impl >> 0x20) -
                    (float)((ulong)_Var2._M_head_impl >> 0x20),
                    SUB84(_Var1._M_head_impl,0) - SUB84(_Var2._M_head_impl,0));
      local_68._M_value =
           (ulong)this[7].samplePublisher._M_t.
                  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
                  .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl ^ 0x8000000000000000;
      local_48 = extraout_XMM0_Da;
      std::operator*(&local_60,&local_68);
      fVar11 = (ABS((extraout_XMM0_Da_00 - local_48) + 1.0) -
               ABS((extraout_XMM0_Da_00 - local_48) + -1.0)) * 0.5;
      fVar13 = *(float *)((long)&this[1].samplePublisher._M_t.
                                 super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                                 .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl + 4)
               * fVar11 +
               *(float *)&(this->samplePublisher)._M_t.
                          super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                          .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      *(float *)&(this->samplePublisher)._M_t.
                 super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
                 super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                 super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = fVar13;
      fVar9 = *(float *)((long)&(this->samplePublisher)._M_t.
                                super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                                .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl + 4);
      fVar10 = *(float *)&this[1].samplePublisher._M_t.
                          super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                          .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
      fVar12 = fVar10;
      if ((fVar13 < fVar9) || (fVar12 = fVar9, fVar10 < fVar13)) {
        fVar13 = fVar12;
        *(float *)&(this->samplePublisher)._M_t.
                   super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                   super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl = fVar13;
      }
      *(float *)&this[2].samplePublisher._M_t.
                 super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
                 super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                 super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
           fVar11 * *(float *)((long)&this[2].samplePublisher._M_t.
                                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl
                              + 4) + fVar13 +
           *(float *)&this[2].samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    }
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::erase
              ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_80._8_8_,
               __first,__first._M_current + uVar6);
    psVar4 = local_50;
    _Var1._M_head_impl =
         this[0xc].samplePublisher._M_t.
         super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t.
         super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
         super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (SamplePublisher *)0x0) {
      SamplePublisher::publish(_Var1._M_head_impl,(Samples *)local_88);
    }
    local_80._16_8_ = local_88;
    local_88 = (undefined1  [8])0x0;
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              ((psVar4->
               super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,(unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                         *)(local_80 + 0x10));
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)(local_80 + 0x10));
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)local_88);
  }
  std::
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 *)local_80);
  return;
}

Assistant:

void ClockRecovery::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  tmp_.insert(tmp_.end(), input->begin(), input->end());

  // Return read buffer (it has been copied into tmp_)
  qin->pushRead(std::move(input));

  // Omega is number of samples per symbol, so this
  // estimates the number of symbols we should find in this call.
  auto nsamples = tmp_.size();
  output->clear();
  output->reserve(nsamples / omega_);

  // Process 1 sample per iteration.
  // This does not allow vectorization but is more stable than the
  // vectorized implementation (see git history of this file).
  // It is roughly 15% slower than previous implementation.
  size_t i = 0;
  while (i < nsamples) {
    float muf;
    int mui;
    const std::complex<float>* s;

    // Populate phase and sample pointer
    muf = (float) mu_;
    mui = (int) mu_;
    s = &tmp_[i + mui];

    // Check that we don't go out of range
    if ((i + mui + 7) >= nsamples) {
      break;
    }

    // In range; update sample index and phase
    i += mui;
    mu_ -= mui;

    // Normalize mu to [0.0, 1.0) so we can use it to
    // choose the right interpolation filter.
    muf = muf - (float) mui;

    // Run interpolator to get interpolated samples at offset mu
    std::complex<float> acc = 0.0f;
    const auto taps = mmseTaps[(int) (muf * 128.0f)];
    for (auto k = 0; k < NUM_TAPS; k++) {
      acc += taps[k] * s[k];
    }

    // Push down sample
    p2t_ = p1t_;
    p1t_ = p0t_;
    p0t_ = acc;

    // Push down associated complex quadrant
    c2t_ = c1t_;
    c1t_ = c0t_;
    c0t_.real((p0t_.real() > 0.0f ? 1.0f : 0.0f));
    c0t_.imag((p0t_.imag() > 0.0f ? 1.0f : 0.0f));

    // Use interpolated sample as output
    // Then use the estimated error to update omega_ and mu_
    output->push_back(p0t_);

    // Compute error
    std::complex<float> x = (c0t_ - c2t_) * std::conj(p1t_);
    std::complex<float> y = (p0t_ - p2t_) * std::conj(c1t_);
    std::complex<float> u = y - x;

    // Clip error to [-1.0, 1.0]
    float mm = u.real();
    mm = 0.5f * (fabsf(mm + 1.0f) - fabsf(mm - 1.0f));

    // Update omega
    omega_ += omegaGain_ * mm;

    // Wrap omega if it hits the lower or upper bound.
    // If the algorithm is biased to always increase omega at a
    // certain point, it will wrap and start from minimum, in the
    // hope it locks on to the signal again.
    if (omega_ < omegaMin_) {
      omega_ = omegaMax_;
    }
    if (omega_ > omegaMax_) {
      omega_ = omegaMin_;
    }

    // Update mu with new omega
    // It is OK if this is bigger than 1.0 because that means
    // we need to skip a few samples in the next iteration.
    mu_ += omega_ + muGain_ * mm;
  }

  // Index i was not used yet. Copy the sample at index i and
  // everything after it to the beginning of the sample buffer.
  tmp_.erase(tmp_.begin(), tmp_.begin() + i);

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}